

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall
cmCTest::HandleCommandLineArguments
          (cmCTest *this,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errormsg)

{
  pointer pbVar1;
  mapped_type pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  mapped_type *ppcVar9;
  ostream *poVar10;
  cmCTestGenericHandler *pcVar11;
  cmCTest *pcVar12;
  double dVar13;
  string arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  long repeat;
  ostringstream cmCTestLog_msg;
  
  pcVar12 = (cmCTest *)&arg;
  std::__cxx11::string::string
            ((string *)pcVar12,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + *i));
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          pcVar12,"-F");
  if (bVar3) {
    this->Failover = true;
  }
  bVar3 = CheckArgument(pcVar12,&arg,"-j","--parallel");
  if (bVar3) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= *i)
    goto LAB_002e1f0f;
    sVar7 = *i + 1;
    *i = sVar7;
    iVar5 = atoi(pbVar1[sVar7]._M_dataplus._M_p);
LAB_002e1f54:
    iVar6 = 1;
    if (1 < iVar5) {
      iVar6 = iVar5;
    }
    this->ParallelLevel = iVar6;
    this->ParallelLevelSetInCli = true;
  }
  else {
LAB_002e1f0f:
    lVar8 = std::__cxx11::string::find((char *)&arg,0x5b30fb);
    if (lVar8 == 0) {
      std::__cxx11::string::substr((ulong)&cmCTestLog_msg,(ulong)&arg);
      iVar5 = atoi(_cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      goto LAB_002e1f54;
    }
  }
  bVar3 = std::operator==(&arg,"--repeat-until-fail");
  if (bVar3) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar7 = *i + 1;
      *i = sVar7;
      repeat = 1;
      bVar3 = cmSystemTools::StringToLong(pbVar1[sVar7]._M_dataplus._M_p,&repeat);
      if (bVar3) {
        this->RepeatTests = (int)repeat;
        if (1 < repeat) {
          this->RepeatUntilFail = true;
        }
        goto LAB_002e1fd4;
      }
      std::operator+(&local_1d0,"\'--repeat-until-fail\' given non-integer value \'",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + *i);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,&local_1d0,"\'");
      std::__cxx11::string::operator=((string *)errormsg,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    else {
      std::__cxx11::string::assign((char *)errormsg);
    }
    bVar3 = false;
  }
  else {
LAB_002e1fd4:
    bVar3 = std::operator==(&arg,"--test-load");
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
        sVar7 = *i + 1;
        *i = sVar7;
        bVar3 = cmSystemTools::StringToULong
                          (pbVar1[sVar7]._M_dataplus._M_p,(unsigned_long *)&repeat);
        if (bVar3) {
          this->TestLoad = repeat;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"Invalid value for \'Test Load\' : ")
          ;
          poVar10 = std::operator<<(poVar10,(string *)
                                            ((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + *i));
          std::endl<char,std::char_traits<char>>(poVar10);
          std::__cxx11::stringbuf::str();
          Log(this,5,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x6d8,local_1d0._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        }
      }
    }
    bVar3 = std::operator==(&arg,"--no-compress-output");
    if (bVar3) {
      this->CompressTestOutput = false;
    }
    bVar3 = std::operator==(&arg,"--print-labels");
    if (bVar3) {
      this->PrintLabels = true;
    }
    bVar3 = std::operator==(&arg,"--http1.0");
    if (bVar3) {
      this->UseHTTP10 = true;
    }
    bVar3 = std::operator==(&arg,"--timeout");
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
        sVar7 = *i + 1;
        *i = sVar7;
        dVar13 = atof(pbVar1[sVar7]._M_dataplus._M_p);
        this->GlobalTimeout = dVar13;
      }
    }
    pcVar12 = (cmCTest *)&arg;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pcVar12,"--stop-time");
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
        sVar7 = *i + 1;
        *i = sVar7;
        pcVar12 = this;
        SetStopTime(this,pbVar1 + sVar7);
      }
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-C","--build-config");
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
        sVar7 = *i + 1;
        *i = sVar7;
        SetConfigType(this,pbVar1[sVar7]._M_dataplus._M_p);
      }
    }
    bVar3 = std::operator==(&arg,"--debug");
    if (bVar3) {
      this->Debug = true;
      this->ShowLineNumbers = true;
    }
    bVar3 = std::operator==(&arg,"--track");
    if ((bVar3) &&
       (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
      *i = *i + 1;
      std::__cxx11::string::_M_assign((string *)&this->SpecificTrack);
    }
    bVar3 = std::operator==(&arg,"--show-line-numbers");
    if (bVar3) {
      this->ShowLineNumbers = true;
    }
    bVar3 = std::operator==(&arg,"--no-label-summary");
    if (bVar3) {
      this->LabelSummary = false;
    }
    pcVar12 = (cmCTest *)&arg;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pcVar12,"--no-subproject-summary");
    if (bVar3) {
      this->SubprojectSummary = false;
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-Q","--quiet");
    if (bVar3) {
      this->Quiet = true;
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-V","--verbose");
    if (bVar3) {
      this->Verbose = true;
    }
    pcVar12 = (cmCTest *)&arg;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pcVar12,"-B");
    if (bVar3) {
      this->BatchJobs = true;
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-VV","--extra-verbose");
    if (bVar3) {
      this->Verbose = true;
      this->ExtraVerbose = true;
    }
    bVar3 = std::operator==(&arg,"--output-on-failure");
    if (bVar3) {
      this->OutputTestOutputOnTestFailure = true;
    }
    bVar3 = std::operator==(&arg,"--test-output-size-passed");
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
        sVar7 = *i + 1;
        *i = sVar7;
        bVar3 = cmSystemTools::StringToLong(pbVar1[sVar7]._M_dataplus._M_p,&repeat);
        if (bVar3) {
          std::__cxx11::string::string((string *)&cmCTestLog_msg,"test",(allocator *)&local_1d0);
          ppcVar9 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                    ::operator[](&this->TestingHandlers,(key_type *)&cmCTestLog_msg);
          pcVar2 = *ppcVar9;
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          if (pcVar2 != (mapped_type)0x0) {
            *(undefined4 *)
             ((long)&pcVar2[1].PersistentOptions._M_t._M_impl.super__Rb_tree_header._M_node_count +
             4) = (undefined4)repeat;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,
                                    "Invalid value for \'--test-output-size-passed\': ");
          poVar10 = std::operator<<(poVar10,(string *)
                                            ((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + *i));
          std::operator<<(poVar10,"\n");
          std::__cxx11::stringbuf::str();
          Log(this,5,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x726,local_1d0._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        }
      }
    }
    pcVar12 = (cmCTest *)&arg;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pcVar12,"--test-output-size-failed");
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
        sVar7 = *i + 1;
        *i = sVar7;
        bVar3 = cmSystemTools::StringToLong(pbVar1[sVar7]._M_dataplus._M_p,&repeat);
        if (bVar3) {
          std::__cxx11::string::string((string *)&cmCTestLog_msg,"test",(allocator *)&local_1d0);
          ppcVar9 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                    ::operator[](&this->TestingHandlers,(key_type *)&cmCTestLog_msg);
          pcVar2 = *ppcVar9;
          pcVar12 = (cmCTest *)&cmCTestLog_msg;
          std::__cxx11::string::~string((string *)pcVar12);
          if (pcVar2 != (mapped_type)0x0) {
            *(undefined4 *)&pcVar2[1].Command = (undefined4)repeat;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,
                                    "Invalid value for \'--test-output-size-failed\': ");
          poVar10 = std::operator<<(poVar10,(string *)
                                            ((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + *i));
          std::operator<<(poVar10,"\n");
          std::__cxx11::stringbuf::str();
          Log(this,5,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x735,local_1d0._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&local_1d0);
          pcVar12 = (cmCTest *)&cmCTestLog_msg;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pcVar12);
        }
      }
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-N","--show-only");
    if (bVar3) {
      this->ShowOnly = true;
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-O","--output-log");
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
        sVar7 = *i + 1;
        *i = sVar7;
        SetOutputLogFileName(this,pbVar1[sVar7]._M_dataplus._M_p);
      }
    }
    bVar3 = std::operator==(&arg,"--tomorrow-tag");
    if (bVar3) {
      this->TomorrowTag = true;
    }
    pcVar12 = (cmCTest *)&arg;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pcVar12,"--force-new-ctest-process");
    if (bVar3) {
      this->ForceNewCTestProcess = true;
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-W","--max-width");
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
        sVar7 = *i + 1;
        *i = sVar7;
        iVar5 = atoi(pbVar1[sVar7]._M_dataplus._M_p);
        this->MaxTestNameWidth = iVar5;
      }
    }
    bVar3 = std::operator==(&arg,"--interactive-debug-mode");
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
        sVar7 = *i + 1;
        *i = sVar7;
        bVar3 = cmSystemTools::IsOn(pbVar1[sVar7]._M_dataplus._M_p);
        this->InteractiveDebugMode = bVar3;
      }
    }
    bVar3 = std::operator==(&arg,"--submit-index");
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
        sVar7 = *i + 1;
        *i = sVar7;
        iVar6 = atoi(pbVar1[sVar7]._M_dataplus._M_p);
        iVar5 = 0;
        if (0 < iVar6) {
          iVar5 = iVar6;
        }
        this->SubmitIndex = iVar5;
      }
    }
    pcVar12 = (cmCTest *)&arg;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pcVar12,"--overwrite");
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*i < ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
        sVar7 = *i + 1;
        *i = sVar7;
        pcVar12 = this;
        AddCTestConfigurationOverwrite(this,pbVar1 + sVar7);
      }
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-A","--add-notes");
    if ((bVar3) &&
       (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
      this->ProduceXML = true;
      SetTest(this,"Notes",true);
      sVar7 = *i;
      *i = sVar7 + 1;
      pcVar12 = this;
      SetNotesFiles(this,(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[sVar7 + 1]._M_dataplus._M_p);
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-I","--tests-information");
    if ((bVar3) &&
       (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
      *i = *i + 1;
      pcVar11 = GetHandler(this,"test");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"TestsToRunInformation",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      pcVar11 = GetHandler(this,"memcheck");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"TestsToRunInformation",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      pcVar12 = (cmCTest *)&cmCTestLog_msg;
      std::__cxx11::string::~string((string *)pcVar12);
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-U","--union");
    if (bVar3) {
      pcVar11 = GetHandler(this,"test");
      std::__cxx11::string::string((string *)&cmCTestLog_msg,"UseUnion",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption(pcVar11,(string *)&cmCTestLog_msg,"true");
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      pcVar11 = GetHandler(this,"memcheck");
      std::__cxx11::string::string((string *)&cmCTestLog_msg,"UseUnion",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption(pcVar11,(string *)&cmCTestLog_msg,"true");
      pcVar12 = (cmCTest *)&cmCTestLog_msg;
      std::__cxx11::string::~string((string *)pcVar12);
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-R","--tests-regex");
    if ((bVar3) &&
       (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
      *i = *i + 1;
      pcVar11 = GetHandler(this,"test");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"IncludeRegularExpression",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      pcVar11 = GetHandler(this,"memcheck");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"IncludeRegularExpression",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      pcVar12 = (cmCTest *)&cmCTestLog_msg;
      std::__cxx11::string::~string((string *)pcVar12);
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-L","--label-regex");
    if ((bVar3) &&
       (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
      *i = *i + 1;
      pcVar11 = GetHandler(this,"test");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"LabelRegularExpression",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      pcVar11 = GetHandler(this,"memcheck");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"LabelRegularExpression",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      pcVar12 = (cmCTest *)&cmCTestLog_msg;
      std::__cxx11::string::~string((string *)pcVar12);
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-LE","--label-exclude");
    if ((bVar3) &&
       (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
      *i = *i + 1;
      pcVar11 = GetHandler(this,"test");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"ExcludeLabelRegularExpression",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      pcVar11 = GetHandler(this,"memcheck");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"ExcludeLabelRegularExpression",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      pcVar12 = (cmCTest *)&cmCTestLog_msg;
      std::__cxx11::string::~string((string *)pcVar12);
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-E","--exclude-regex");
    if ((bVar3) &&
       (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
      *i = *i + 1;
      pcVar11 = GetHandler(this,"test");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"ExcludeRegularExpression",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      pcVar11 = GetHandler(this,"memcheck");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"ExcludeRegularExpression",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      pcVar12 = (cmCTest *)&cmCTestLog_msg;
      std::__cxx11::string::~string((string *)pcVar12);
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-FA","--fixture-exclude-any");
    if ((bVar3) &&
       (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
      *i = *i + 1;
      pcVar11 = GetHandler(this,"test");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"ExcludeFixtureRegularExpression",(allocator *)&local_1d0
                );
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      pcVar11 = GetHandler(this,"memcheck");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"ExcludeFixtureRegularExpression",(allocator *)&local_1d0
                );
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      pcVar12 = (cmCTest *)&cmCTestLog_msg;
      std::__cxx11::string::~string((string *)pcVar12);
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-FS","--fixture-exclude-setup");
    if ((bVar3) &&
       (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
      *i = *i + 1;
      pcVar11 = GetHandler(this,"test");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"ExcludeFixtureSetupRegularExpression",
                 (allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      pcVar11 = GetHandler(this,"memcheck");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"ExcludeFixtureSetupRegularExpression",
                 (allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      pcVar12 = (cmCTest *)&cmCTestLog_msg;
      std::__cxx11::string::~string((string *)pcVar12);
    }
    bVar3 = CheckArgument(pcVar12,&arg,"-FC","--fixture-exclude-cleanup");
    if ((bVar3) &&
       (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
      *i = *i + 1;
      pcVar11 = GetHandler(this,"test");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"ExcludeFixtureCleanupRegularExpression",
                 (allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      pcVar11 = GetHandler(this,"memcheck");
      std::__cxx11::string::string
                ((string *)&cmCTestLog_msg,"ExcludeFixtureCleanupRegularExpression",
                 (allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (pcVar11,(string *)&cmCTestLog_msg,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
    bVar4 = std::operator==(&arg,"--rerun-failed");
    bVar3 = true;
    if (bVar4) {
      pcVar11 = GetHandler(this,"test");
      std::__cxx11::string::string((string *)&cmCTestLog_msg,"RerunFailed",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption(pcVar11,(string *)&cmCTestLog_msg,"true");
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      pcVar11 = GetHandler(this,"memcheck");
      std::__cxx11::string::string((string *)&cmCTestLog_msg,"RerunFailed",(allocator *)&local_1d0);
      cmCTestGenericHandler::SetPersistentOption(pcVar11,(string *)&cmCTestLog_msg,"true");
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
  }
  std::__cxx11::string::~string((string *)&arg);
  return bVar3;
}

Assistant:

bool cmCTest::HandleCommandLineArguments(size_t& i,
                                         std::vector<std::string>& args,
                                         std::string& errormsg)
{
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-F")) {
    this->Failover = true;
  }
  if (this->CheckArgument(arg, "-j", "--parallel") && i < args.size() - 1) {
    i++;
    int plevel = atoi(args[i].c_str());
    this->SetParallelLevel(plevel);
    this->ParallelLevelSetInCli = true;
  } else if (arg.find("-j") == 0) {
    int plevel = atoi(arg.substr(2).c_str());
    this->SetParallelLevel(plevel);
    this->ParallelLevelSetInCli = true;
  }
  if (this->CheckArgument(arg, "--repeat-until-fail")) {
    if (i >= args.size() - 1) {
      errormsg = "'--repeat-until-fail' requires an argument";
      return false;
    }
    i++;
    long repeat = 1;
    if (!cmSystemTools::StringToLong(args[i].c_str(), &repeat)) {
      errormsg =
        "'--repeat-until-fail' given non-integer value '" + args[i] + "'";
      return false;
    }
    this->RepeatTests = static_cast<int>(repeat);
    if (repeat > 1) {
      this->RepeatUntilFail = true;
    }
  }

  if (this->CheckArgument(arg, "--test-load") && i < args.size() - 1) {
    i++;
    unsigned long load;
    if (cmSystemTools::StringToULong(args[i].c_str(), &load)) {
      this->SetTestLoad(load);
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for 'Test Load' : " << args[i] << std::endl);
    }
  }

  if (this->CheckArgument(arg, "--no-compress-output")) {
    this->CompressTestOutput = false;
  }

  if (this->CheckArgument(arg, "--print-labels")) {
    this->PrintLabels = true;
  }

  if (this->CheckArgument(arg, "--http1.0")) {
    this->UseHTTP10 = true;
  }

  if (this->CheckArgument(arg, "--timeout") && i < args.size() - 1) {
    i++;
    double timeout = (double)atof(args[i].c_str());
    this->GlobalTimeout = timeout;
  }

  if (this->CheckArgument(arg, "--stop-time") && i < args.size() - 1) {
    i++;
    this->SetStopTime(args[i]);
  }

  if (this->CheckArgument(arg, "-C", "--build-config") &&
      i < args.size() - 1) {
    i++;
    this->SetConfigType(args[i].c_str());
  }

  if (this->CheckArgument(arg, "--debug")) {
    this->Debug = true;
    this->ShowLineNumbers = true;
  }
  if (this->CheckArgument(arg, "--track") && i < args.size() - 1) {
    i++;
    this->SpecificTrack = args[i];
  }
  if (this->CheckArgument(arg, "--show-line-numbers")) {
    this->ShowLineNumbers = true;
  }
  if (this->CheckArgument(arg, "--no-label-summary")) {
    this->LabelSummary = false;
  }
  if (this->CheckArgument(arg, "--no-subproject-summary")) {
    this->SubprojectSummary = false;
  }
  if (this->CheckArgument(arg, "-Q", "--quiet")) {
    this->Quiet = true;
  }
  if (this->CheckArgument(arg, "-V", "--verbose")) {
    this->Verbose = true;
  }
  if (this->CheckArgument(arg, "-B")) {
    this->BatchJobs = true;
  }
  if (this->CheckArgument(arg, "-VV", "--extra-verbose")) {
    this->ExtraVerbose = true;
    this->Verbose = true;
  }
  if (this->CheckArgument(arg, "--output-on-failure")) {
    this->OutputTestOutputOnTestFailure = true;
  }
  if (this->CheckArgument(arg, "--test-output-size-passed") &&
      i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmSystemTools::StringToLong(args[i].c_str(), &outputSize)) {
      if (cmCTestTestHandler* pCTestTestHandler =
            static_cast<cmCTestTestHandler*>(this->TestingHandlers["test"])) {
        pCTestTestHandler->SetTestOutputSizePassed(int(outputSize));
      }
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-passed': " << args[i]
                                                                   << "\n");
    }
  }
  if (this->CheckArgument(arg, "--test-output-size-failed") &&
      i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmSystemTools::StringToLong(args[i].c_str(), &outputSize)) {
      if (cmCTestTestHandler* pCTestTestHandler =
            static_cast<cmCTestTestHandler*>(this->TestingHandlers["test"])) {
        pCTestTestHandler->SetTestOutputSizeFailed(int(outputSize));
      }
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-failed': " << args[i]
                                                                   << "\n");
    }
  }
  if (this->CheckArgument(arg, "-N", "--show-only")) {
    this->ShowOnly = true;
  }

  if (this->CheckArgument(arg, "-O", "--output-log") && i < args.size() - 1) {
    i++;
    this->SetOutputLogFileName(args[i].c_str());
  }

  if (this->CheckArgument(arg, "--tomorrow-tag")) {
    this->TomorrowTag = true;
  }
  if (this->CheckArgument(arg, "--force-new-ctest-process")) {
    this->ForceNewCTestProcess = true;
  }
  if (this->CheckArgument(arg, "-W", "--max-width") && i < args.size() - 1) {
    i++;
    this->MaxTestNameWidth = atoi(args[i].c_str());
  }
  if (this->CheckArgument(arg, "--interactive-debug-mode") &&
      i < args.size() - 1) {
    i++;
    this->InteractiveDebugMode = cmSystemTools::IsOn(args[i].c_str());
  }
  if (this->CheckArgument(arg, "--submit-index") && i < args.size() - 1) {
    i++;
    this->SubmitIndex = atoi(args[i].c_str());
    if (this->SubmitIndex < 0) {
      this->SubmitIndex = 0;
    }
  }

  if (this->CheckArgument(arg, "--overwrite") && i < args.size() - 1) {
    i++;
    this->AddCTestConfigurationOverwrite(args[i]);
  }
  if (this->CheckArgument(arg, "-A", "--add-notes") && i < args.size() - 1) {
    this->ProduceXML = true;
    this->SetTest("Notes");
    i++;
    this->SetNotesFiles(args[i].c_str());
  }

  // options that control what tests are run
  if (this->CheckArgument(arg, "-I", "--tests-information") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption("TestsToRunInformation",
                                                  args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("TestsToRunInformation", args[i].c_str());
  }
  if (this->CheckArgument(arg, "-U", "--union")) {
    this->GetHandler("test")->SetPersistentOption("UseUnion", "true");
    this->GetHandler("memcheck")->SetPersistentOption("UseUnion", "true");
  }
  if (this->CheckArgument(arg, "-R", "--tests-regex") && i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption("IncludeRegularExpression",
                                                  args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("IncludeRegularExpression", args[i].c_str());
  }
  if (this->CheckArgument(arg, "-L", "--label-regex") && i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption("LabelRegularExpression",
                                                  args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("LabelRegularExpression", args[i].c_str());
  }
  if (this->CheckArgument(arg, "-LE", "--label-exclude") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption(
      "ExcludeLabelRegularExpression", args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeLabelRegularExpression", args[i].c_str());
  }

  if (this->CheckArgument(arg, "-E", "--exclude-regex") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption("ExcludeRegularExpression",
                                                  args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeRegularExpression", args[i].c_str());
  }

  if (this->CheckArgument(arg, "-FA", "--fixture-exclude-any") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption(
      "ExcludeFixtureRegularExpression", args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeFixtureRegularExpression",
                            args[i].c_str());
  }
  if (this->CheckArgument(arg, "-FS", "--fixture-exclude-setup") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption(
      "ExcludeFixtureSetupRegularExpression", args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeFixtureSetupRegularExpression",
                            args[i].c_str());
  }
  if (this->CheckArgument(arg, "-FC", "--fixture-exclude-cleanup") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption(
      "ExcludeFixtureCleanupRegularExpression", args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeFixtureCleanupRegularExpression",
                            args[i].c_str());
  }

  if (this->CheckArgument(arg, "--rerun-failed")) {
    this->GetHandler("test")->SetPersistentOption("RerunFailed", "true");
    this->GetHandler("memcheck")->SetPersistentOption("RerunFailed", "true");
  }
  return true;
}